

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O3

void __thiscall ThreadPool::add(ThreadPool *this,AbstractTaskProvider *provider,size_t taskCount)

{
  pointer __s;
  pointer puVar1;
  int iVar2;
  imageException *this_00;
  AbstractTaskProvider *local_28;
  
  local_28 = provider;
  if (taskCount == 0) {
    this_00 = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(this_00,"Try to add zero tasks to thread pool");
  }
  else {
    if ((this->_worker).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->_worker).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start) {
      iVar2 = pthread_mutex_lock((pthread_mutex_t *)&provider->_completion);
      if (iVar2 == 0) {
        provider->_running = true;
        pthread_mutex_unlock((pthread_mutex_t *)&provider->_completion);
        iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->_taskInfo);
        if (iVar2 == 0) {
          std::__cxx11::list<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>::
          insert(&this->_task,(const_iterator)&this->_task,taskCount,&local_28);
          __s = (this->_run).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
          puVar1 = (this->_run).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          if (__s != puVar1) {
            memset(__s,1,(long)puVar1 - (long)__s);
          }
          std::condition_variable::notify_all();
          pthread_mutex_unlock((pthread_mutex_t *)&this->_taskInfo);
          return;
        }
      }
      std::__throw_system_error(iVar2);
    }
    this_00 = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(this_00,"No threads in thread pool");
  }
  __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void ThreadPool::add( AbstractTaskProvider * provider, size_t taskCount )
{
    if( taskCount == 0 )
        throw imageException( "Try to add zero tasks to thread pool" );

    if( threadCount() == 0 )
        throw imageException( "No threads in thread pool" );

    provider->_completion.lock();
    provider->_running = true;
    provider->_completion.unlock();

    _taskInfo.lock();

    _task.insert( _task.end(), taskCount, provider );

    std::fill( _run.begin(), _run.end(), 1 );
    _waiting.notify_all();

    _taskInfo.unlock();
}